

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMainMethod *stm)

{
  initializer_list<INode_*> __l;
  allocator local_111;
  string local_110 [32];
  ChildrenAnswers local_f0;
  vector<INode_*,_std::allocator<INode_*>_> local_c0;
  undefined1 local_a8 [8];
  ChildrenAnswers answers;
  allocator<INode_*> local_61;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CMainMethod *stm_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)stm;
  std::operator<<((ostream *)&std::cout,"Point\n");
  local_60 = std::unique_ptr<CType,_std::default_delete<CType>_>::get
                       ((unique_ptr<CType,_std::default_delete<CType>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 3));
  local_58 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::get
                       ((unique_ptr<CIdExp,_std::default_delete<CIdExp>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  local_50 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::get
                       ((unique_ptr<CFieldList,_std::default_delete<CFieldList>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6));
  local_48 = std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::get
                       ((unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 5));
  local_40 = &local_60;
  local_38 = 4;
  std::allocator<INode_*>::allocator(&local_61);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_61);
  std::allocator<INode_*>::~allocator(&local_61);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_c0,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_a8,this,&local_c0);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_c0);
  ChildrenAnswers::ChildrenAnswers(&local_f0,(ChildrenAnswers *)local_a8);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_f0);
  ChildrenAnswers::~ChildrenAnswers(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"MainMethod",&local_111);
  AddLabel(this,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_a8);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CMainMethod &stm) {
	std::cout << "Point\n";
	std::vector<INode*> children = { stm.returnType.get(), stm.args.get(), stm.vars.get(), stm.statements.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("MainMethod");
	++lastVisited;
}